

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O0

void __thiscall
TypeCheckingVisitor::PreVisit(TypeCheckingVisitor *this,ClassDeclaration *class_declaration)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ClassDeclaration *local_18;
  ClassDeclaration *class_declaration_local;
  TypeCheckingVisitor *this_local;
  
  this->type_count_ = this->type_count_ + 1;
  mVar1 = this->type_count_;
  local_18 = class_declaration;
  class_declaration_local = (ClassDeclaration *)this;
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->type_system_,&class_declaration->class_name_);
  *pmVar2 = mVar1;
  this->type_count_ = this->type_count_ + 1;
  mVar1 = this->type_count_;
  std::operator+(&local_38,&local_18->class_name_,"[]");
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->type_system_,&local_38);
  *pmVar2 = mVar1;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void TypeCheckingVisitor::PreVisit(ClassDeclaration* class_declaration) {
  ++type_count_;
  type_system_[class_declaration->class_name_] = type_count_;

  ++type_count_;
  type_system_[class_declaration->class_name_ + "[]"] = type_count_;
}